

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

void __thiscall re2::ByteMapBuilder::~ByteMapBuilder(ByteMapBuilder *this)

{
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *unaff_retaddr;
  
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector(unaff_retaddr);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

ByteMapBuilder() {
    // Initial state: the [0-255] range has color 256.
    // This will avoid problems during the second phase,
    // in which we assign byte classes numbered from 0.
    splits_.Set(255);
    colors_[255] = 256;
    nextcolor_ = 257;
  }